

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall ccs::anon_unknown_0::Lexer::multilineComment(Lexer *this)

{
  int iVar1;
  int iVar2;
  parse_error *this_00;
  Location where;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream _message;
  int c;
  Lexer *this_local;
  
  while( true ) {
    iVar1 = Buf::get(&this->stream_);
    if (iVar1 == -1) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::operator<<((ostream *)local_190,"Unterminated multi-line comment");
      this_00 = (parse_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      where = Buf::location(&this->stream_);
      parse_error::parse_error(this_00,&local_1c0,where);
      __cxa_throw(this_00,&(anonymous_namespace)::parse_error::typeinfo,parse_error::~parse_error);
    }
    if ((iVar1 == 0x2a) && (iVar2 = Buf::peek(&this->stream_), iVar2 == 0x2f)) break;
    if ((iVar1 == 0x2f) && (iVar1 = Buf::peek(&this->stream_), iVar1 == 0x2a)) {
      Buf::get(&this->stream_);
      multilineComment(this);
    }
  }
  Buf::get(&this->stream_);
  return;
}

Assistant:

void multilineComment() {
    while (true) {
      int c = stream_.get();
      if (c == EOF)
        THROW(stream_.location(), "Unterminated multi-line comment");
      if (c == '*' && stream_.peek() == '/') {
        stream_.get();
        return;
      }
      if (c == '/' && stream_.peek() == '*') {
        stream_.get();
        multilineComment();
      }
    }
  }